

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertCstrEqual
          (UtestShell *this,char *expected,char *actual,char *text,char *fileName,size_t lineNumber,
          TestTerminator *testTerminator)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  TestResult *pTVar6;
  SimpleString local_138;
  StringEqualFailure local_128;
  SimpleString local_b0;
  StringEqualFailure local_a0;
  size_t local_38;
  size_t lineNumber_local;
  char *fileName_local;
  char *text_local;
  char *actual_local;
  char *expected_local;
  UtestShell *this_local;
  
  local_38 = lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = text;
  text_local = actual;
  actual_local = expected;
  expected_local = (char *)this;
  pTVar6 = getTestResult(this);
  (*pTVar6->_vptr_TestResult[10])();
  pcVar4 = actual_local;
  pcVar3 = text_local;
  sVar2 = lineNumber_local;
  sVar1 = local_38;
  if ((text_local != (char *)0x0) || (actual_local != (char *)0x0)) {
    if ((text_local == (char *)0x0) || (actual_local == (char *)0x0)) {
      SimpleString::SimpleString(&local_b0,fileName_local);
      StringEqualFailure::StringEqualFailure
                (&local_a0,this,(char *)sVar2,sVar1,pcVar4,pcVar3,&local_b0);
      (*this->_vptr_UtestShell[0x27])(this,&local_a0,testTerminator);
      StringEqualFailure::~StringEqualFailure(&local_a0);
      SimpleString::~SimpleString(&local_b0);
    }
    iVar5 = SimpleString::StrCmp(actual_local,text_local);
    pcVar4 = actual_local;
    pcVar3 = text_local;
    sVar2 = lineNumber_local;
    sVar1 = local_38;
    if (iVar5 != 0) {
      SimpleString::SimpleString(&local_138,fileName_local);
      StringEqualFailure::StringEqualFailure
                (&local_128,this,(char *)sVar2,sVar1,pcVar4,pcVar3,&local_138);
      (*this->_vptr_UtestShell[0x27])(this,&local_128,testTerminator);
      StringEqualFailure::~StringEqualFailure(&local_128);
      SimpleString::~SimpleString(&local_138);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrEqual(const char* expected, const char* actual, const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(StringEqualFailure(this, fileName, lineNumber, expected, actual, text), testTerminator);
    if (SimpleString::StrCmp(expected, actual) != 0)
        failWith(StringEqualFailure(this, fileName, lineNumber, expected, actual, text), testTerminator);
}